

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::PostsolveBasis
          (Model *this,vector<int,_std::allocator<int>_> *basic_status_solver,Int *cbasis_user,
          Int *vbasis_user)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  long in_RCX;
  long in_RDX;
  Model *in_RDI;
  vector<int,_std::allocator<int>_> vbasis_temp;
  vector<int,_std::allocator<int>_> cbasis_temp;
  Int n;
  Int m;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  iterator in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  Model *in_stack_ffffffffffffff80;
  
  rows(in_RDI);
  cols(in_RDI);
  std::allocator<int>::allocator((allocator<int> *)0x8495a6);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38._M_current,
             (allocator_type *)in_stack_ffffffffffffff30._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x8495cc);
  __first._M_current = (int *)(long)in_RDI->num_var_;
  std::allocator<int>::allocator((allocator<int> *)0x8495ec);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__first._M_current,
             (size_type)in_stack_ffffffffffffff38._M_current,
             (allocator_type *)in_stack_ffffffffffffff30._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x84960c);
  DualizeBackBasis(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
  ScaleBackBasis((Model *)__first._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_current);
  if (in_RDX != 0) {
    in_stack_ffffffffffffff38 =
         std::begin<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 =
         std::end<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff18);
    std::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
              (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       in_stack_ffffffffffffff38._M_current,in_stack_ffffffffffffff30._M_current);
  }
  if (in_RCX != 0) {
    std::begin<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff18);
    std::end<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff18);
    std::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
              (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       in_stack_ffffffffffffff38._M_current,in_stack_ffffffffffffff30._M_current);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_current);
  return;
}

Assistant:

void Model::PostsolveBasis(const std::vector<Int>& basic_status_solver,
                           Int* cbasis_user, Int* vbasis_user) const {
    const Int m = rows();
    const Int n = cols();
    assert((Int)basic_status_solver.size() == n+m);

    std::vector<Int> cbasis_temp(num_constr_);
    std::vector<Int> vbasis_temp(num_var_);
    DualizeBackBasis(basic_status_solver, cbasis_temp, vbasis_temp);
    ScaleBackBasis(cbasis_temp, vbasis_temp);
    if (cbasis_user)
        std::copy(std::begin(cbasis_temp), std::end(cbasis_temp), cbasis_user);
    if (vbasis_user)
        std::copy(std::begin(vbasis_temp), std::end(vbasis_temp), vbasis_user);
}